

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O1

bool ask_user_bool(char *szPrompt,bool bDefault)

{
  undefined7 in_register_00000031;
  char *pcVar1;
  char enter [30];
  byte local_58 [40];
  
  local_58[0x10] = 0;
  local_58[0x11] = 0;
  local_58[0x12] = 0;
  local_58[0x13] = 0;
  local_58[0x14] = 0;
  local_58[0x15] = 0;
  local_58[0x16] = 0;
  local_58[0x17] = 0;
  local_58[0x18] = 0;
  local_58[0x19] = 0;
  local_58[0x1a] = 0;
  local_58[0x1b] = 0;
  local_58[0x1c] = 0;
  local_58[0x1d] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  pcVar1 = "y,<n>";
  if ((int)CONCAT71(in_register_00000031,bDefault) != 0) {
    pcVar1 = "<y>,n";
  }
  do {
    while( true ) {
      printf("%s (%s): ",szPrompt,pcVar1);
      fgets((char *)local_58,0x1d,_stdin);
      if (local_58[0] < 0x6e) break;
      if (local_58[0] == 0x6e) {
        return false;
      }
      if (local_58[0] == 0x79) {
        return true;
      }
    }
    if (local_58[0] == 0) {
      return bDefault;
    }
  } while (local_58[0] != 10);
  return bDefault;
}

Assistant:

bool
ask_user_bool (const char* szPrompt, bool bDefault)
{
    char    enter[30] = "";
    const char *szSelVals;
    if(bDefault){
        szSelVals = "<y>,n";
    }else{
        szSelVals = "y,<n>";
    }

    do{
        printf("%s (%s): ", szPrompt, szSelVals);
        fgets(enter, sizeof(enter)-1, stdin);
    }while('y' != enter[0] && 'n' != enter[0] &&
	   '\0' != enter[0] && '\n' != enter[0]);

    switch(enter[0]){
    case 'y':
        return true;
    case 'n':
        return false;
    }
    return bDefault;
}